

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

bool __thiscall BrokerClient::start(BrokerClient *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = MlmWrap::initialize(&this->super_MlmWrap);
  if (iVar1 == 0) {
    iVar1 = MlmWrap::setProducer(&this->super_MlmWrap,"Trodes");
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool BrokerClient::start(){
    if(initialize()){
        //Could not initialize! 
        return false;
    }
    if(setProducer(TRODES_NETWORK_ID)){
        return false;
    }
    return true;
}